

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::setRobotState
          (KinDynComputations *this,Span<const_double,__1L> s,Span<const_double,__1L> s_dot,
          Span<const_double,__1L> world_gravity)

{
  bool bVar1;
  SpatialMotionVector ret;
  Twist base_velocity;
  Transform world_T_base;
  Vector3 local_128;
  VectorDynSize local_108 [32];
  SpatialMotionVector local_e8;
  Twist local_b8 [48];
  Transform local_88 [96];
  
  iDynTree::Transform::Identity();
  local_e8.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] =
       0.0;
  local_e8.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] =
       0.0;
  local_e8.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       0.0;
  local_e8.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] =
       0.0;
  local_e8.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       0.0;
  local_e8.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] =
       0.0;
  iDynTree::Twist::Twist(local_b8,&local_e8);
  iDynTree::VectorDynSize::VectorDynSize
            ((VectorDynSize *)&local_e8,s.storage_.super_extent_type<_1L>.size_.size_,
             s.storage_.data_);
  iDynTree::VectorDynSize::VectorDynSize
            (local_108,s_dot.storage_.super_extent_type<_1L>.size_.size_,s_dot.storage_.data_);
  if (world_gravity.storage_.super_extent_type<_1L>.size_ == 3) {
    local_128.m_data[2] = world_gravity.storage_.data_[2];
    local_128.m_data[0] = *world_gravity.storage_.data_;
    local_128.m_data[1] = world_gravity.storage_.data_[1];
  }
  else {
    iDynTree::reportError
              ("VectorFixSize","constructor",
               "input vector does not have the right number of elements");
    local_128.m_data[0] = 0.0;
    local_128.m_data[1] = 0.0;
    local_128.m_data[2] = 0.0;
  }
  bVar1 = setRobotState(this,local_88,(VectorDynSize *)&local_e8,local_b8,local_108,&local_128);
  iDynTree::VectorDynSize::~VectorDynSize(local_108);
  iDynTree::VectorDynSize::~VectorDynSize((VectorDynSize *)&local_e8);
  return bVar1;
}

Assistant:

bool KinDynComputations::setRobotState(Span<const double> s,
                                       Span<const double> s_dot,
                                       Span<const double> world_gravity)
{
    Transform world_T_base = Transform::Identity();
    Twist base_velocity = Twist::Zero();

    return setRobotState(world_T_base, s,
                         base_velocity, s_dot,
                         world_gravity);
}